

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O2

Lazy<std::pair<std::error_code,_unsigned_long>_> __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::async_read_write<true>
          (basic_seq_coro_file<(coro_io::execution_type)1> *this,
          span<char,_18446744073709551615UL> buf)

{
  _func_int **pp_Var1;
  _func_int *in_RCX;
  
  pp_Var1 = (_func_int **)operator_new(0xb0,(nothrow_t *)&std::nothrow);
  if (pp_Var1 == (_func_int **)0x0) {
    (this->executor_wrapper_).super_Executor._vptr_Executor = (_func_int **)0x0;
  }
  else {
    *pp_Var1 = async_read_write<true>;
    pp_Var1[1] = async_read_write<true>;
    pp_Var1[0x14] = in_RCX;
    pp_Var1[0x13] = (_func_int *)buf._M_extent._M_extent_value._M_extent_value;
    pp_Var1[0x12] = (_func_int *)buf._M_ptr;
    pp_Var1[2] = (_func_int *)0x0;
    pp_Var1[3] = (_func_int *)0x0;
    pp_Var1[4] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var1 + 8) = 0;
    (this->executor_wrapper_).super_Executor._vptr_Executor = pp_Var1;
    *(undefined1 *)(pp_Var1 + 0x15) = 0;
  }
  return (LazyBase<std::pair<std::error_code,_unsigned_long>,_false>)
         (LazyBase<std::pair<std::error_code,_unsigned_long>,_false>)this;
}

Assistant:

async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_read_write(
      std::span<char> buf) {
    auto result = co_await coro_io::post(
        [this, buf]() -> std::pair<std::error_code, size_t> {
          if constexpr (is_read) {
            if (frw_seq_file_.read(buf.data(), buf.size())) {
              return std::make_pair(std::error_code{}, frw_seq_file_.gcount());
            }
          }
          else {
            if (frw_seq_file_.write(buf.data(), buf.size())) {
              return std::make_pair(std::error_code{}, buf.size());
            }
          }

          if (frw_seq_file_.eof()) {
            eof_ = true;
            return std::make_pair(std::error_code{}, frw_seq_file_.gcount());
          }

          return std::make_pair(std::make_error_code(std::errc::io_error), 0);
        },
        &executor_wrapper_);

    co_return result.value();
  }